

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int ly_path_data2schema_subexp
              (ly_ctx *ctx,lys_node *orig_parent,lys_module *cur_mod,lyxp_expr *exp,
              uint16_t *cur_exp,char **out,uint16_t *out_used)

{
  lyxp_token lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  byte *__s;
  char *pcVar6;
  lys_node *last;
  lys_module *plVar7;
  lys_module *plVar8;
  lys_node *plVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  ushort **ppuVar13;
  byte *__s2;
  LY_ERR no;
  LY_VLOG_ELEM elem_type;
  ushort uVar14;
  byte *pbVar15;
  ulong uVar16;
  long lVar17;
  LY_ECODE ecode;
  ushort uVar18;
  lyxp_token lVar19;
  short sVar20;
  short sVar21;
  bool bVar22;
  lys_module *local_68;
  lys_node *local_48;
  
  uVar14 = *cur_exp;
  uVar16 = (ulong)uVar14;
  lVar1 = exp->tokens[uVar16];
  if (lVar1 == LYXP_TOKEN_PAR1) {
    iVar4 = ly_path_data2schema_copy_token(ctx,exp,uVar14,out,out_used);
    if (iVar4 != 0) {
LAB_0010a823:
      __s = (byte *)0x0;
LAB_0010acbd:
      free(__s);
      return -1;
    }
    uVar5 = *cur_exp + 1;
    *cur_exp = (uint16_t)uVar5;
    lVar19 = LYXP_TOKEN_PAR2;
LAB_0010a838:
    bVar22 = false;
    uVar16 = (ulong)uVar5;
    bVar3 = false;
  }
  else {
    lVar19 = LYXP_TOKEN_NONE;
    bVar3 = true;
    if (lVar1 == LYXP_TOKEN_OPERATOR_PATH) {
      bVar22 = orig_parent == (lys_node *)0x0;
    }
    else {
      bVar22 = true;
      if (lVar1 == LYXP_TOKEN_BRACK1) {
        iVar4 = ly_path_data2schema_copy_token(ctx,exp,uVar14,out,out_used);
        if (iVar4 != 0) goto LAB_0010a823;
        uVar5 = *cur_exp + 1;
        *cur_exp = (uint16_t)uVar5;
        lVar19 = LYXP_TOKEN_BRACK2;
        goto LAB_0010a838;
      }
    }
  }
  bVar2 = false;
  local_68 = cur_mod;
  local_48 = orig_parent;
LAB_0010a84e:
  uVar14 = (ushort)uVar16;
  if (exp->used <= uVar14) {
    if (!bVar3) {
      ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
      return -1;
    }
    return 0;
  }
  uVar16 = uVar16 & 0xffff;
  switch(exp->tokens[uVar16]) {
  case LYXP_TOKEN_PAR1:
  case LYXP_TOKEN_BRACK1:
    iVar4 = ly_path_data2schema_subexp(ctx,local_48,local_68,exp,cur_exp,out,out_used);
    goto LAB_0010a8a0;
  default:
    if (bVar3 || exp->tokens[uVar16] != lVar19) {
      uVar16 = (ulong)(uint)((int)uVar16 * 2);
      __s = (byte *)0x0;
      ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid token used (%.*s).",
             (ulong)*(ushort *)((long)exp->tok_len + uVar16),
             exp->expr + *(ushort *)((long)exp->expr_pos + uVar16));
    }
    else {
      iVar4 = ly_path_data2schema_copy_token(ctx,exp,uVar14,out,out_used);
      __s = (byte *)0x0;
      if (iVar4 == 0) {
        return 0;
      }
    }
    goto LAB_0010acbd;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_NAMETEST:
    if (bVar2) {
      iVar4 = ly_path_data2schema_copy_token(ctx,exp,uVar14,out,out_used);
      bVar2 = true;
      goto LAB_0010a8a0;
    }
    uVar16 = (ulong)(uint)((int)uVar16 * 2);
    __s = (byte *)strndup(exp->expr + *(ushort *)((long)exp->expr_pos + uVar16),
                          (ulong)*(ushort *)((long)exp->tok_len + uVar16));
    if (__s == (byte *)0x0) {
      pcVar6 = "Memory allocation failed (%s()).";
      pcVar11 = "ly_path_data2schema_subexp";
      no = LY_EMEM;
LAB_0010ad6a:
      __s = (byte *)0x0;
      ly_log(ctx,LY_LLERR,no,pcVar6,pcVar11);
      goto LAB_0010acbd;
    }
    pcVar6 = strchr((char *)__s,0x3a);
    if (pcVar6 == (char *)0x0) {
      if (bVar22) {
        ecode = LYE_PATH_MISSMOD;
        elem_type = LY_VLOG_NONE;
        __s2 = (byte *)0x0;
LAB_0010acb2:
        ly_vlog(ctx,ecode,elem_type,__s2);
        goto LAB_0010acbd;
      }
      pbVar15 = (byte *)0x0;
    }
    else {
      *pcVar6 = '\0';
      pbVar15 = (byte *)(pcVar6 + 1);
      if ((bVar22) &&
         (local_68 = ly_ctx_get_module(ctx,(char *)__s,(char *)0x0,0), local_68 == (lys_module *)0x0
         )) {
        ly_vlog(ctx,LYE_PATH_INMOD,LY_VLOG_STR,__s);
        goto LAB_0010acbd;
      }
    }
    __s2 = __s;
    if (pbVar15 != (byte *)0x0) {
      __s2 = pbVar15;
    }
    if ((*__s2 | 4) == 0x2e) {
      free(__s);
      if (!bVar3) {
        pcVar6 = "Invalid path used (%s in a subexpression).";
        no = LY_EINVAL;
        pcVar11 = (char *)0x0;
        goto LAB_0010ad6a;
      }
      iVar4 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
      bVar22 = false;
      if (iVar4 == 0) {
        bVar2 = true;
        goto LAB_0010a8a8;
      }
      goto LAB_0010a823;
    }
    last = (lys_node *)0x0;
    do {
      while( true ) {
        do {
          last = lys_getnext(last,local_48,local_68,0x100);
          if (last == (lys_node *)0x0) {
            ecode = LYE_PATH_INNODE;
            elem_type = LY_VLOG_STR;
            goto LAB_0010acb2;
          }
          iVar4 = strcmp(last->name,(char *)__s2);
        } while (iVar4 != 0);
        plVar7 = lys_node_module(last);
        if (pbVar15 == (byte *)0x0) break;
        iVar4 = strcmp(plVar7->name,(char *)__s);
        if (iVar4 == 0) goto LAB_0010aa3e;
      }
      plVar8 = lys_node_module(local_48);
    } while (plVar7 != plVar8);
LAB_0010aa3e:
    sVar20 = 0;
    plVar9 = last;
    while (plVar9 != local_48) {
      plVar9 = lys_parent(plVar9);
      if ((plVar9 == (lys_node *)0x0) || (plVar9->nodetype != LYS_USES)) {
        sVar20 = sVar20 + 1;
      }
    }
    lVar17 = 0;
    pcVar6 = "";
    while (bVar22 = sVar20 != 0, sVar20 = sVar20 + -1, plVar9 = last, sVar21 = sVar20, bVar22) {
      for (; sVar21 != 0; sVar21 = sVar21 - (ushort)(plVar9->nodetype != LYS_USES)) {
        plVar9 = lys_parent(plVar9);
        if (plVar9 == (lys_node *)0x0) {
          __assert_fail("node2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/common.c"
                        ,0x43b,
                        "int ly_path_data2schema_subexp(const struct ly_ctx *, const struct lys_node *, const struct lys_module *, struct lyxp_expr *, uint16_t *, char **, uint16_t *)"
                       );
        }
      }
      plVar7 = lys_node_module(plVar9);
      if (plVar7 == local_68 && local_48 != (lys_node *)0x0) {
        sVar10 = strlen(plVar9->name);
        uVar14 = (short)lVar17 + (short)sVar10;
        pcVar11 = (char *)ly_realloc(*out,(ulong)uVar14 + (ulong)*out_used);
        *out = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_0010acd9;
        sprintf(pcVar11 + ((ulong)*out_used - 1),"%s%s",pcVar6,plVar9->name);
      }
      else {
        plVar7 = lys_node_module(plVar9);
        sVar10 = strlen(plVar7->name);
        sVar12 = strlen(plVar9->name);
        uVar16 = sVar12 + lVar17 + sVar10 + 1;
        uVar14 = (ushort)uVar16;
        pcVar11 = (char *)ly_realloc(*out,(uVar16 & 0xffff) + (ulong)*out_used);
        *out = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_0010acd9;
        uVar18 = *out_used;
        plVar7 = lys_node_module(plVar9);
        sprintf(pcVar11 + ((ulong)uVar18 - 1),"%s%s:%s",pcVar6,plVar7->name,plVar9->name);
      }
      *out_used = uVar14 + *out_used;
      lVar17 = 1;
      pcVar6 = "/";
    }
    ppuVar13 = __ctype_b_loc();
    sVar20 = 1;
    uVar14 = 0;
    do {
      uVar18 = uVar14;
      sVar20 = sVar20 + -1;
      uVar14 = uVar18 + 1;
    } while ((*(byte *)((long)*ppuVar13 +
                       (long)exp->expr[(ulong)((uint)*(ushort *)
                                                      ((long)exp->expr_pos +
                                                      (ulong)((uint)*cur_exp * 2)) + (uint)uVar18) +
                                       (ulong)*(ushort *)
                                               ((long)exp->tok_len + (ulong)((uint)*cur_exp * 2))] *
                       2 + 1) & 0x20) != 0);
    if (sVar20 != 0) {
      pcVar6 = (char *)ly_realloc(*out,(ulong)((uint)*out_used + (uint)uVar18));
      *out = pcVar6;
      if (pcVar6 == (char *)0x0) {
LAB_0010acd9:
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_data2schema_subexp")
        ;
        goto LAB_0010acbd;
      }
      sprintf(pcVar6 + ((ulong)*out_used - 1),"%*s",(ulong)(uint)uVar18," ");
      *out_used = *out_used - sVar20;
    }
    free(__s);
    bVar22 = false;
    bVar2 = false;
    local_48 = last;
    goto LAB_0010a8a8;
  case LYXP_TOKEN_COMMA:
  case LYXP_TOKEN_OPERATOR_LOG:
  case LYXP_TOKEN_OPERATOR_COMP:
  case LYXP_TOKEN_OPERATOR_MATH:
  case LYXP_TOKEN_OPERATOR_UNI:
    bVar22 = true;
    local_48 = orig_parent;
    bVar2 = false;
    break;
  case LYXP_TOKEN_NODETYPE:
  case LYXP_TOKEN_FUNCNAME:
  case LYXP_TOKEN_LITERAL:
  case LYXP_TOKEN_NUMBER:
    break;
  case LYXP_TOKEN_OPERATOR_PATH:
    if (exp->tok_len[uVar16] == 2) {
      bVar2 = true;
    }
  }
  iVar4 = ly_path_data2schema_copy_token(ctx,exp,uVar14,out,out_used);
LAB_0010a8a0:
  if (iVar4 != 0) goto LAB_0010a823;
LAB_0010a8a8:
  uVar16 = (ulong)(*cur_exp + 1);
  *cur_exp = (uint16_t)(*cur_exp + 1);
  goto LAB_0010a84e;
}

Assistant:

static int
ly_path_data2schema_subexp(const struct ly_ctx *ctx, const struct lys_node *orig_parent, const struct lys_module *cur_mod,
                           struct lyxp_expr *exp, uint16_t *cur_exp, char **out, uint16_t *out_used)
{
    uint16_t j, k, len, slash;
    char *str = NULL, *col;
    const struct lys_node *node, *node2, *parent;
    enum lyxp_token end_token = 0;
    int first, path_lost;

    switch (exp->tokens[*cur_exp]) {
    case LYXP_TOKEN_BRACK1:
        end_token = LYXP_TOKEN_BRACK2;

        if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
            goto error;
        }
        ++(*cur_exp);
        first = 0;
        break;
    case LYXP_TOKEN_PAR1:
        end_token = LYXP_TOKEN_PAR2;

        if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
            goto error;
        }
        ++(*cur_exp);
        first = 0;
        break;
    case LYXP_TOKEN_OPERATOR_PATH:
        first = (orig_parent) ? 0 : 1;
        break;
    default:
        first = 1;
        break;
    }

    path_lost = 0;
    parent = orig_parent;
    while (*cur_exp < exp->used) {
        switch (exp->tokens[*cur_exp]) {
        case LYXP_TOKEN_DOT:
        case LYXP_TOKEN_DDOT:
        case LYXP_TOKEN_NAMETEST:
            if (path_lost) {
                /* we do not know anything anymore, just copy it */
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }
                break;
            }

            str = strndup(exp->expr + exp->expr_pos[*cur_exp], exp->tok_len[*cur_exp]);
            LY_CHECK_ERR_GOTO(!str, LOGMEM(ctx), error);

            col = strchr(str, ':');
            if (col) {
                *col = '\0';
                ++col;
            }

            /* first node */
            if (first) {
                if (!col) {
                    LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_NONE, NULL);
                    goto error;
                }

                cur_mod = ly_ctx_get_module(ctx, str, NULL, 0);
                if (!cur_mod) {
                    LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                    goto error;
                }

                first = 0;
            }

            if (((col ? col[0] : str[0]) == '.') || ((col ? col[0] : str[0]) == '*')) {
                free(str);
                str = NULL;

                if (end_token) {
                    LOGERR(ctx, LY_EINVAL, "Invalid path used (%s in a subexpression).", str);
                    goto error;
                }

                /* we can no longer evaluate the path, so just copy the rest */
                path_lost = 1;
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }
                break;
            }

            /* create schema path for this data node */
            node = NULL;
            while ((node = lys_getnext(node, parent, cur_mod, LYS_GETNEXT_NOSTATECHECK))) {
                if (strcmp(node->name, col ? col : str)) {
                    continue;
                }

                if (col && strcmp(lys_node_module(node)->name, str)) {
                    continue;
                }
                if (!col && (lys_node_module(node) != lys_node_module(parent))) {
                    continue;
                }

                /* determine how deep the node actually is, we must generate the path from the highest parent */
                j = 0;
                node2 = node;
                while (node2 != parent) {
                    node2 = lys_parent(node2);
                    if (!node2 || (node2->nodetype != LYS_USES)) {
                        ++j;
                    }
                }

                /* first node, do not print '/' */
                slash = 0;
                while (j) {
                    k = j - 1;
                    node2 = node;
                    while (k) {
                        node2 = lys_parent(node2);
                        assert(node2);
                        if (node2->nodetype != LYS_USES) {
                            --k;
                        }
                    }

                    if ((lys_node_module(node2) != cur_mod) || !parent) {
                        /* module name and node name */
                        len = slash + strlen(lys_node_module(node2)->name) + 1 + strlen(node2->name);
                        *out = ly_realloc(*out, *out_used + len);
                        LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                        sprintf(*out + *out_used - 1, "%s%s:%s", slash ? "/" : "", lys_node_module(node2)->name, node2->name);
                        *out_used += len;
                    } else {
                        /* only node name */
                        len = slash + strlen(node2->name);
                        *out = ly_realloc(*out, *out_used + len);
                        LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                        sprintf(*out + *out_used - 1, "%s%s", slash ? "/" : "", node2->name);
                        *out_used += len;
                    }

                    slash = 1;
                    --j;
                }

                break;
            }
            if (!node) {
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, col ? col : str);
                goto error;
            }

            /* copy any whitespaces */
            for (len = 0; isspace(exp->expr[exp->expr_pos[*cur_exp] + exp->tok_len[*cur_exp] + len]); ++len);
            if (len) {
                *out = ly_realloc(*out, *out_used + len);
                LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                sprintf(*out + *out_used - 1, "%*s", len, " ");
                *out_used += len;
            }

            /* next iteration */
            free(str);
            str = NULL;
            parent = node;
            break;
        case LYXP_TOKEN_COMMA:
        case LYXP_TOKEN_OPERATOR_LOG:
        case LYXP_TOKEN_OPERATOR_COMP:
        case LYXP_TOKEN_OPERATOR_MATH:
        case LYXP_TOKEN_OPERATOR_UNI:
            /* reset the processing */
            first = 1;
            path_lost = 0;
            parent = orig_parent;

            /* fallthrough */
        case LYXP_TOKEN_OPERATOR_PATH:
            if ((exp->tokens[*cur_exp] == LYXP_TOKEN_OPERATOR_PATH) && (exp->tok_len[*cur_exp] == 2)) {
                /* we can no longer evaluate the path further */
                path_lost = 1;
            }
            /* fallthrough */
        case LYXP_TOKEN_NODETYPE:
        case LYXP_TOKEN_FUNCNAME:
        case LYXP_TOKEN_LITERAL:
        case LYXP_TOKEN_NUMBER:
            /* just copy it */
            if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                goto error;
            }
            break;
        case LYXP_TOKEN_BRACK1:
        case LYXP_TOKEN_PAR1:
            if (ly_path_data2schema_subexp(ctx, parent, cur_mod, exp, cur_exp, out, out_used)) {
                goto error;
            }
            break;
        default:
            if (end_token && (exp->tokens[*cur_exp] == end_token)) {
                /* we are done (with this subexpression) */
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }

                return 0;
            }
            LOGERR(ctx, LY_EINVAL, "Invalid token used (%.*s).", exp->tok_len[*cur_exp], exp->expr + exp->expr_pos[*cur_exp]);
            goto error;
        }

        ++(*cur_exp);
    }

    if (end_token) {
        LOGVAL(ctx, LYE_XPATH_EOF, LY_VLOG_NONE, NULL);
        return -1;
    }

    return 0;

error:
    free(str);
    return -1;
}